

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O0

void print_http_headers(http_message_t *hmsg)

{
  undefined8 *puVar1;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 uVar3;
  char *pcVar4;
  http_header_t *header;
  ListNode *node;
  http_message_t *hmsg_local;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  if (hmsg->is_request == 0) {
    pcVar4 = (hmsg->status_msg).buf;
    UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpparser.c",0x8c5,
               "resp status = %d, version = %d.%d, status msg = %.*s\n",
               (ulong)(uint)hmsg->status_code,CONCAT44(uVar2,hmsg->major_version),
               hmsg->minor_version,CONCAT44(uVar3,(int)(hmsg->status_msg).length),pcVar4);
  }
  else {
    pcVar4 = (hmsg->uri).pathquery.buff;
    UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpparser.c",0x8ba,
               "method = %d, version = %d.%d, url = %.*s\n",(ulong)hmsg->method,
               CONCAT44(uVar2,hmsg->major_version),hmsg->minor_version,
               CONCAT44(uVar3,(int)(hmsg->uri).pathquery.size),pcVar4);
  }
  for (header = (http_header_t *)ListHead(&hmsg->headers); header != (http_header_t *)0x0;
      header = (http_header_t *)ListNext(&hmsg->headers,(ListNode *)header)) {
    puVar1 = *(undefined8 **)&header->name_id;
    UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpparser.c",0x8d8,
               "hdr name: %.*s, value: %.*s\n",puVar1[1] & 0xffffffff,*puVar1,(int)puVar1[4],
               puVar1[3],pcVar4);
  }
  return;
}

Assistant:

void print_http_headers(http_message_t *hmsg)
{
	ListNode *node;
	/* NNS:	 dlist_node *node; */
	http_header_t *header;

	/* print start line */
	if (hmsg->is_request) {
		UpnpPrintf(UPNP_ALL,
			HTTP,
			__FILE__,
			__LINE__,
			"method = %d, version = %d.%d, url = %.*s\n",
			hmsg->method,
			hmsg->major_version,
			hmsg->minor_version,
			(int)hmsg->uri.pathquery.size,
			hmsg->uri.pathquery.buff);
	} else {
		UpnpPrintf(UPNP_ALL,
			HTTP,
			__FILE__,
			__LINE__,
			"resp status = %d, version = %d.%d, status msg = "
			"%.*s\n",
			hmsg->status_code,
			hmsg->major_version,
			hmsg->minor_version,
			(int)hmsg->status_msg.length,
			hmsg->status_msg.buf);
	}

	/* print headers */
	node = ListHead(&hmsg->headers);
	/* NNS: node = dlist_first_node( &hmsg->headers ); */
	while (node != NULL) {
		header = (http_header_t *)node->item;
		/* NNS: header = (http_header_t *)node->data; */
		UpnpPrintf(UPNP_ALL,
			HTTP,
			__FILE__,
			__LINE__,
			"hdr name: %.*s, value: %.*s\n",
			(int)header->name.length,
			header->name.buf,
			(int)header->value.length,
			header->value.buf);

		node = ListNext(&hmsg->headers, node);
		/* NNS: node = dlist_next( &hmsg->headers, node ); */
	}
}